

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sec.c
# Opt level: O0

edata_t * sec_alloc(tsdn_t *tsdn,pai_t *self,size_t size,size_t alignment,_Bool zero,_Bool guarded,
                   _Bool frequent_reuse,_Bool *deferred_work_generated)

{
  byte bVar1;
  uint uVar2;
  sec_shard_t *sec_00;
  byte bVar3;
  tsdn_t *in_RCX;
  byte bVar4;
  ulong in_RDX;
  sec_t *in_RSI;
  tsdn_t *in_RDI;
  byte in_R8B;
  undefined4 in_R9D;
  byte in_stack_00000008;
  edata_t *edata;
  _Bool do_batch_fill;
  sec_bin_t *bin;
  sec_shard_t *shard;
  pszind_t pszind;
  sec_t *sec;
  pszind_t ind;
  pszind_t base_ind;
  pszind_t rg_inner_off;
  pszind_t lg_delta;
  pszind_t off_to_first_ps_rg;
  pszind_t x;
  sec_bin_t *in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff60;
  ulong uVar5;
  _Bool zero_00;
  size_t in_stack_ffffffffffffff78;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  byte bVar6;
  pai_t *in_stack_ffffffffffffff88;
  sec_shard_t *shard_00;
  tsdn_t *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined5 in_stack_ffffffffffffffa8;
  edata_t *local_30;
  uint local_4;
  
  bVar4 = in_R8B & 1;
  bVar3 = (byte)in_R9D & 1;
  bVar1 = in_stack_00000008 & 1;
  if ((((bVar4 == 0) && (in_RCX < (tsdn_t *)0x1001)) && ((in_RSI->opts).nshards != 0)) &&
     (in_RDX <= (in_RSI->opts).max_alloc)) {
    if (in_RDX < 0x7000000000000001) {
      uVar5 = in_RDX;
      uVar2 = lg_ceil(0x2567eaa);
      if (uVar2 < 0xe) {
        in_stack_ffffffffffffff60 = 0;
      }
      else {
        in_stack_ffffffffffffff60 = uVar2 - 0xe;
      }
      if (in_stack_ffffffffffffff60 == 0) {
        in_stack_ffffffffffffff5c = 0xc;
      }
      else {
        in_stack_ffffffffffffff5c = in_stack_ffffffffffffff60 + 0xb;
      }
      local_4 = in_stack_ffffffffffffff60 * 4 +
                ((uint)(in_RDX - 1 >> ((byte)in_stack_ffffffffffffff5c & 0x3f)) & 3);
      in_RDX = uVar5;
    }
    else {
      local_4 = 199;
    }
    sec_00 = sec_shard_pick(in_RDI,in_RSI);
    shard_00 = (sec_shard_t *)(sec_00->bins + local_4);
    bVar6 = 0;
    malloc_mutex_lock(in_RCX,(malloc_mutex_t *)CONCAT44(in_R9D,in_stack_ffffffffffffff60));
    local_30 = sec_shard_alloc_locked
                         (in_RCX,(sec_t *)CONCAT44(in_R9D,in_stack_ffffffffffffff60),
                          (sec_shard_t *)
                          CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                          in_stack_ffffffffffffff50);
    if (((local_30 == (edata_t *)0x0) &&
        ((undefined1  [112])((undefined1  [112])(shard_00->mtx).field_0 & (undefined1  [112])0x1) ==
         (undefined1  [112])0x0)) && ((in_RSI->opts).batch_fill_extra != 0)) {
      *(_Bool *)&(shard_00->mtx).field_0 = true;
      bVar6 = 1;
    }
    malloc_mutex_unlock((tsdn_t *)CONCAT44(in_R9D,in_stack_ffffffffffffff60),
                        (malloc_mutex_t *)
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if (local_30 == (edata_t *)0x0) {
      zero_00 = SUB81(in_RDX >> 0x38,0);
      if ((bVar6 & 1) == 0) {
        local_30 = pai_alloc((tsdn_t *)sec_00,(pai_t *)shard_00,
                             CONCAT17(bVar6,in_stack_ffffffffffffff80),0,zero_00,
                             SUB81(in_RDX >> 0x30,0),SUB81(in_RDX >> 0x28,0),
                             (_Bool *)CONCAT17(bVar4,CONCAT16(bVar3,CONCAT15(bVar1,
                                                  in_stack_ffffffffffffffa8))));
      }
      else {
        local_30 = sec_batch_fill_and_alloc
                             ((tsdn_t *)CONCAT44(local_4,in_stack_ffffffffffffff98),(sec_t *)sec_00,
                              shard_00,(sec_bin_t *)CONCAT17(bVar6,in_stack_ffffffffffffff80),0,
                              zero_00);
      }
    }
  }
  else {
    local_30 = pai_alloc(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                         CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80),
                         in_stack_ffffffffffffff78,SUB81(in_RDX >> 0x38,0),SUB81(in_RDX >> 0x30,0),
                         SUB81(in_RDX >> 0x28,0),
                         (_Bool *)(CONCAT17(in_R8B,CONCAT16((byte)in_R9D,
                                                            CONCAT15(in_stack_00000008,
                                                                     in_stack_ffffffffffffffa8))) &
                                  0x10101ffffffffff));
  }
  return local_30;
}

Assistant:

static edata_t *
sec_alloc(tsdn_t *tsdn, pai_t *self, size_t size, size_t alignment, bool zero,
    bool guarded, bool frequent_reuse, bool *deferred_work_generated) {
	assert((size & PAGE_MASK) == 0);
	assert(!guarded);

	sec_t *sec = (sec_t *)self;

	if (zero || alignment > PAGE || sec->opts.nshards == 0
	    || size > sec->opts.max_alloc) {
		return pai_alloc(tsdn, sec->fallback, size, alignment, zero,
		    /* guarded */ false, frequent_reuse,
		    deferred_work_generated);
	}
	pszind_t pszind = sz_psz2ind(size);
	assert(pszind < sec->npsizes);

	sec_shard_t *shard = sec_shard_pick(tsdn, sec);
	sec_bin_t *bin = &shard->bins[pszind];
	bool do_batch_fill = false;

	malloc_mutex_lock(tsdn, &shard->mtx);
	edata_t *edata = sec_shard_alloc_locked(tsdn, sec, shard, bin);
	if (edata == NULL) {
		if (!bin->being_batch_filled
		    && sec->opts.batch_fill_extra > 0) {
			bin->being_batch_filled = true;
			do_batch_fill = true;
		}
	}
	malloc_mutex_unlock(tsdn, &shard->mtx);
	if (edata == NULL) {
		if (do_batch_fill) {
			edata = sec_batch_fill_and_alloc(tsdn, sec, shard, bin,
			    size, frequent_reuse);
		} else {
			edata = pai_alloc(tsdn, sec->fallback, size, alignment,
			    zero, /* guarded */ false, frequent_reuse,
			    deferred_work_generated);
		}
	}
	return edata;
}